

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amp1394Time.cpp
# Opt level: O0

void Amp1394_Sleep(double sec)

{
  undefined1 local_28 [8];
  timespec ts;
  long nSecInSec;
  double sec_local;
  
  ts.tv_nsec = 1000000000;
  local_28 = (undefined1  [8])(long)sec;
  ts.tv_sec = (__time_t)((sec - (double)(long)local_28) * 1000000000.0);
  nanosleep((timespec *)local_28,(timespec *)0x0);
  return;
}

Assistant:

void Amp1394_Sleep(double sec)
{
#ifdef _MSC_VER
    // A waitable timer seems to be better than the Windows Sleep().
    HANDLE WaitTimer;
    LARGE_INTEGER dueTime;
    sec *= -10.0 * 1000.0 * 1000.0;
    dueTime.QuadPart = static_cast<LONGLONG>(sec); //dueTime is in 100ns
    // We don't name the timer (third parameter) because CreateWaitableTimer will fail if the name
    // matches an existing name (e.g., if two threads call osaSleep).
    WaitTimer = CreateWaitableTimer(NULL, true, NULL);
    SetWaitableTimer(WaitTimer, &dueTime, 0, NULL, NULL, 0);
    WaitForSingleObject(WaitTimer, INFINITE);
    CloseHandle(WaitTimer);
#else
    const long nSecInSec =  1000L * 1000L * 1000L;
    struct timespec ts;
    ts.tv_sec = static_cast<long> (sec);
    ts.tv_nsec = static_cast<long> ( (sec-ts.tv_sec) * nSecInSec );
    nanosleep(&ts, NULL);
#endif
}